

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O1

ssize_t __thiscall axl::io::ShmtWriter::write(ShmtWriter *this,int __fd,void *__buf,size_t __n)

{
  int32_t *piVar1;
  ShmtFileHdr *pSVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t extraout_RDX_01;
  __sighandler_t p_Var9;
  __sighandler_t extraout_RDX_02;
  __sighandler_t __handler;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  ulong uVar14;
  bool bVar15;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_68;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  uVar14 = 0;
  if (__n != 0) {
    sVar5 = 0;
    do {
      uVar14 = uVar14 + *(long *)((long)__buf + sVar5 * 8);
      sVar5 = sVar5 + 1;
    } while (__n != sVar5);
  }
  if (uVar14 == 0) {
    return 0;
  }
  uVar6 = uVar14 + 0xf & 0xfffffffffffffff8;
  if (((this->super_ShmtBase).m_flags >> 0x10 & 1) == 0) {
    uVar6 = uVar14;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->m_writeLock);
  pSVar2 = (this->super_ShmtBase).m_hdr;
  while( true ) {
    piVar1 = &pSVar2->m_lock;
    LOCK();
    bVar15 = *piVar1 == 0;
    if (bVar15) {
      *piVar1 = 1;
    }
    UNLOCK();
    if (bVar15) break;
    sched_yield();
  }
  pSVar2 = (this->super_ShmtBase).m_hdr;
  if (((pSVar2->m_dataSize != 0) && (pSVar2->m_writeOffset <= pSVar2->m_readOffset)) &&
     ((ulong)pSVar2->m_readOffset < pSVar2->m_writeOffset + uVar6)) {
    pSVar2 = (this->super_ShmtBase).m_hdr;
    uVar7 = pSVar2->m_dataSize;
    while (((uVar7 != 0 && (pSVar2->m_writeOffset <= pSVar2->m_readOffset)) &&
           (((ulong)pSVar2->m_readOffset < pSVar2->m_writeOffset + uVar6 &&
            ((pSVar2->m_state & 4) == 0))))) {
      pSVar2->m_readSemaphoreWaitCount = pSVar2->m_readSemaphoreWaitCount + 1;
      LOCK();
      if (pSVar2->m_lock == 1) {
        pSVar2->m_lock = 0;
      }
      UNLOCK();
      iVar4 = sem_wait((sem_t *)(this->super_ShmtBase).m_readSemaphore.m_sem.
                                super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                .m_h);
      if (iVar4 != 0) {
        err::setLastSystemError();
      }
      pSVar2 = (this->super_ShmtBase).m_hdr;
      while( true ) {
        piVar1 = &pSVar2->m_lock;
        LOCK();
        bVar15 = *piVar1 == 0;
        if (bVar15) {
          *piVar1 = 1;
        }
        UNLOCK();
        if (bVar15) break;
        sched_yield();
      }
      pSVar2 = (this->super_ShmtBase).m_hdr;
      uVar7 = pSVar2->m_dataSize;
    }
    if ((pSVar2->m_state & 4) != 0) {
      LOCK();
      if (pSVar2->m_lock == 1) {
        pSVar2->m_lock = 0;
      }
      UNLOCK();
      err::Error::Error((Error *)&local_48,0x10);
      local_68.m_p = (ErrorHdr *)0x0;
      local_68.m_hdr = (BufHdr *)0x0;
      local_68.m_size = 0;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_68,&local_48);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
      err::setError((ErrorRef *)&local_68);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_68);
      uVar13 = 0xffffffffffffffff;
      goto LAB_0012744c;
    }
  }
  pSVar2 = (this->super_ShmtBase).m_hdr;
  uVar10 = (ulong)pSVar2->m_writeOffset;
  piVar1 = &pSVar2->m_lock;
  LOCK();
  if (*piVar1 == 1) {
    *piVar1 = 0;
  }
  UNLOCK();
  bVar15 = ShmtBase::ensureMappingSize(&this->super_ShmtBase,uVar6 + uVar10 + 0x28);
  uVar13 = 0xffffffffffffffff;
  if (bVar15) {
    p_Var9 = extraout_RDX;
    if (((this->super_ShmtBase).m_flags & 0x10000) == 0) {
      if (__n != 0) {
        pcVar11 = (this->super_ShmtBase).m_data + uVar10;
        sVar5 = 0;
        do {
          sVar3 = *(size_t *)((long)__buf + sVar5 * 8);
          __wrap_memcpy(pcVar11,*(void **)(CONCAT44(in_register_00000034,__fd) + sVar5 * 8),sVar3);
          pcVar11 = pcVar11 + sVar3;
          sVar5 = sVar5 + 1;
          p_Var9 = extraout_RDX_00;
        } while (__n != sVar5);
      }
    }
    else {
      pcVar12 = (this->super_ShmtBase).m_data;
      pcVar11 = pcVar12 + uVar10;
      pcVar11[0] = '\n';
      pcVar11[1] = 'm';
      pcVar11[2] = 's';
      pcVar11[3] = ':';
      *(int *)(pcVar12 + uVar10 + 4) = (int)uVar14;
      if (__n != 0) {
        pcVar12 = pcVar12 + uVar10 + 8;
        sVar5 = 0;
        do {
          sVar3 = *(size_t *)((long)__buf + sVar5 * 8);
          __wrap_memcpy(pcVar12,*(void **)(CONCAT44(in_register_00000034,__fd) + sVar5 * 8),sVar3);
          pcVar12 = pcVar12 + sVar3;
          sVar5 = sVar5 + 1;
          p_Var9 = extraout_RDX_01;
        } while (__n != sVar5);
      }
    }
    pSVar2 = (this->super_ShmtBase).m_hdr;
    while( true ) {
      piVar1 = &pSVar2->m_lock;
      LOCK();
      bVar15 = *piVar1 == 0;
      if (bVar15) {
        *piVar1 = 1;
      }
      UNLOCK();
      if (bVar15) break;
      sched_yield();
      p_Var9 = extraout_RDX_02;
    }
    __handler = (__sighandler_t)(uVar6 + uVar10);
    pSVar2 = (this->super_ShmtBase).m_hdr;
    uVar7 = (uint32_t)__handler;
    if ((pSVar2->m_readOffset < pSVar2->m_writeOffset) || (pSVar2->m_dataSize == 0)) {
      uVar8 = 0;
      if (__handler <= (__sighandler_t)this->m_sizeLimitHint) {
        uVar8 = uVar7;
      }
      pSVar2->m_writeOffset = uVar8;
      pSVar2->m_endOffset = uVar7;
    }
    else {
      pSVar2->m_writeOffset = uVar7;
      __handler = p_Var9;
    }
    pSVar2->m_dataSize = pSVar2->m_dataSize + (int)uVar14;
    if (pSVar2->m_writeSemaphoreWaitCount != 0) {
      sys::NamedSemaphore::signal
                (&(this->super_ShmtBase).m_writeSemaphore,pSVar2->m_writeSemaphoreWaitCount,
                 __handler);
      ((this->super_ShmtBase).m_hdr)->m_writeSemaphoreWaitCount = 0;
    }
    piVar1 = &((this->super_ShmtBase).m_hdr)->m_lock;
    LOCK();
    if (*piVar1 == 1) {
      *piVar1 = 0;
    }
    UNLOCK();
    uVar13 = uVar14;
  }
LAB_0012744c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_writeLock);
  return uVar13;
}

Assistant:

size_t
ShmtWriter::write(
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	ASSERT(isOpen());

	bool result;

	size_t chainSize = 0;
	for (size_t i = 0; i < count; i++)
		chainSize += sizeArray[i];

	if (!chainSize)
		return 0;

	size_t writeSize = chainSize;

	if (m_flags & ShmtFlag_Message) {
		writeSize += sizeof(ShmtMessageHdr);
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		writeSize = sl::align<AXL_PTR_SIZE> (writeSize);
#endif
	}

	sys::ScopeLock scopeLock(&m_writeLock); // ensure atomic write

	sys::atomicLock(&m_hdr->m_lock);

	// if buffer is wrapped, then wait until we have enough space

	if (m_hdr->m_dataSize &&
		m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
		m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset) {
		while (
			m_hdr->m_dataSize &&
			m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
			m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset &&
			!(m_hdr->m_state & ShmtState_Disconnected)) {
			m_hdr->m_readSemaphoreWaitCount++;
			sys::atomicUnlock(&m_hdr->m_lock);

			m_readSemaphore.wait();

			sys::atomicLock(&m_hdr->m_lock);
		}

		if (m_hdr->m_state & ShmtState_Disconnected) {
			sys::atomicUnlock(&m_hdr->m_lock);
			err::setError(err::SystemErrorCode_InvalidDeviceState);
			return -1;
		}
	}

	size_t writeOffset = m_hdr->m_writeOffset;

	sys::atomicUnlock(&m_hdr->m_lock);

	size_t writeEndOffset = writeOffset + writeSize;

	result = ensureOffsetMapped(writeEndOffset);
	if (!result)
		return -1;

	if (m_flags & ShmtFlag_Message) {
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		ASSERT(sl::isAligned<AXL_PTR_SIZE> (writeOffset));
#endif

		ShmtMessageHdr* msgHdr = (ShmtMessageHdr*)(m_data + writeOffset);
		msgHdr->m_signature = ShmtConst_MessageSignature;
		msgHdr->m_size = chainSize;
		copyWriteChain(msgHdr + 1, blockArray, sizeArray, count);
	} else {
		copyWriteChain(m_data + writeOffset, blockArray, sizeArray, count);
	}

	sys::atomicLock(&m_hdr->m_lock);

	if (m_hdr->m_writeOffset <= m_hdr->m_readOffset && m_hdr->m_dataSize) { // wrapped
		m_hdr->m_writeOffset = writeEndOffset;
	} else {
		m_hdr->m_writeOffset = writeEndOffset > m_sizeLimitHint ? 0 : writeEndOffset;
		m_hdr->m_endOffset = writeEndOffset;
	}

	m_hdr->m_dataSize += chainSize;

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);

	return chainSize;
}